

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O2

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_cover_from_file(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this,
                   string *cover_file_name)

{
  map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
  *this_00;
  double dVar1;
  int iVar2;
  istream *piVar3;
  long *plVar4;
  mapped_type_conflict1 *pmVar5;
  mapped_type *pmVar6;
  mapped_type *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  int i;
  vector<int,_std::allocator<int>_> cov_number;
  int cov;
  vector<int,_std::allocator<int>_> cov_elts;
  string line;
  stringstream stream;
  ifstream input;
  
  i = 0;
  cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&input,(string *)cover_file_name,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  this_00 = &this->cover_color;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&input,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    if (cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = cov_elts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&line,_S_out|_S_in);
    while( true ) {
      plVar4 = (long *)std::istream::operator>>((istream *)&stream,&cov);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
      std::vector<int,_std::allocator<int>_>::push_back(&cov_elts,&cov);
      std::vector<int,_std::allocator<int>_>::push_back(&cov_number,&cov);
      iVar2 = cov;
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&this->cover_fct,&cov);
      *pmVar5 = iVar2;
      dVar1 = (this->func_color).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[i];
      pmVar6 = std::
               map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
               ::operator[](this_00,&cov);
      pmVar6->second = dVar1 + pmVar6->second;
      pmVar6 = std::
               map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
               ::operator[](this_00,&cov);
      pmVar6->first = pmVar6->first + 1;
      this_01 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->cover_back,&cov);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,&i);
    }
    std::vector<int,_std::allocator<int>_>::operator=
              ((this->cover).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + i,&cov_elts);
    i = i + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  _Var7 = std::
          __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::resize
            (&cov_number,
             (long)_Var7._M_current -
             (long)cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  iVar2 = (int)((ulong)((long)cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)cov_number.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + -1;
  this->maximal_dim = iVar2;
  for (_stream = 0; _stream <= iVar2; _stream = _stream + 1) {
    pmVar6 = std::
             map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
             ::operator[](this_00,(key_type *)&stream);
    iVar2 = pmVar6->first;
    pmVar6 = std::
             map<int,_std::pair<int,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_double>_>_>_>
             ::operator[](this_00,(key_type *)&stream);
    pmVar6->second = pmVar6->second / (double)iVar2;
    iVar2 = this->maximal_dim;
  }
  std::__cxx11::string::_M_assign((string *)&this->cover_name);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&input);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cov_number.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cov_elts.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void set_cover_from_file(const std::string& cover_file_name) {
    int i = 0;
    int cov;
    std::vector<int> cov_elts, cov_number;
    std::ifstream input(cover_file_name);
    std::string line;
    while (std::getline(input, line)) {
      cov_elts.clear();
      std::stringstream stream(line);
      while (stream >> cov) {
        cov_elts.push_back(cov);
        cov_number.push_back(cov);
        cover_fct[cov] = cov;
        cover_color[cov].second += func_color[i];
        cover_color[cov].first++;
        cover_back[cov].push_back(i);
      }
      cover[i] = cov_elts;
      i++;
    }

    std::sort(cov_number.begin(), cov_number.end());
    std::vector<int>::iterator it = std::unique(cov_number.begin(), cov_number.end());
    cov_number.resize(std::distance(cov_number.begin(), it));

    maximal_dim = cov_number.size() - 1;
    for (int i = 0; i <= maximal_dim; i++) cover_color[i].second /= cover_color[i].first;
    cover_name = cover_file_name;
  }